

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::detail::BufferStream::~BufferStream(BufferStream *this)

{
  Stream *in_RDI;
  
  in_RDI->_vptr_Stream = (_func_int **)&PTR__BufferStream_002f4278;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  Stream::~Stream(in_RDI);
  return;
}

Assistant:

~BufferStream() override = default;